

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
* __thiscall
Board::get_endangered_pieces
          (map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
           *__return_storage_ptr__,Board *this,play *single_play)

{
  undefined8 *puVar1;
  _Rb_tree_header *p_Var2;
  short sVar3;
  pointer ppVar4;
  element_type *peVar5;
  pointer ppVar6;
  long lVar7;
  _Rb_tree<Point,_std::pair<const_Point,_std::shared_ptr<Piece>_>,_std::_Select1st<std::pair<const_Point,_std::shared_ptr<Piece>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  *p_Var8;
  map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  *pmVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  _Rb_tree_color _Var12;
  _Base_ptr p_Var13;
  pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_> *move;
  pointer ppVar14;
  map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  endangered_pieces;
  _Rb_tree<Point,_std::pair<const_Point,_std::shared_ptr<Piece>_>,_std::_Select1st<std::pair<const_Point,_std::shared_ptr<Piece>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  _Stack_68;
  map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  *local_38;
  
  _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_68._M_impl.super__Rb_tree_header._M_header;
  _Stack_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar14 = (single_play->
            super__Vector_base<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (single_play->
           super__Vector_base<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  _Stack_68._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar9 = __return_storage_ptr__;
  if (ppVar14 == ppVar4) {
    p_Var11 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    do {
      local_38 = pmVar9;
      peVar5 = (ppVar14->second).super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar5 != (element_type *)0x0) {
        ppVar6 = (peVar5->m_positions).
                 super__Vector_base<std::pair<unsigned_int,_Point>,_std::allocator<std::pair<unsigned_int,_Point>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        sVar3 = ppVar6[-1].second.m_y;
        lVar7 = *(long *)&(this->m_board).m_data.
                          super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[ppVar6[-1].second.m_x].
                          super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
        ;
        pmVar10 = std::
                  map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                  ::operator[]((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                                *)&_Stack_68,&ppVar6[-1].second);
        puVar1 = (undefined8 *)(lVar7 + (long)sVar3 * 0x10);
        (pmVar10->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)*puVar1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar10->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1));
      }
      ppVar6 = *(pointer *)
                ((long)&(((ppVar14->first).super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_positions).
                        super__Vector_base<std::pair<unsigned_int,_Point>,_std::allocator<std::pair<unsigned_int,_Point>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      sVar3 = ppVar6[-1].second.m_y;
      lVar7 = *(long *)&(this->m_board).m_data.
                        super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[ppVar6[-1].second.m_x].
                        super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
      ;
      pmVar10 = std::
                map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                ::operator[]((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                              *)&_Stack_68,&ppVar6[-1].second);
      puVar1 = (undefined8 *)(lVar7 + (long)sVar3 * 0x10);
      (pmVar10->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)*puVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar10->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1));
      ppVar14 = ppVar14 + 1;
      pmVar9 = local_38;
    } while (ppVar14 != ppVar4);
    p_Var11 = &(local_38->_M_t)._M_impl.super__Rb_tree_header._M_header;
    __return_storage_ptr__ = local_38;
    if (_Stack_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      (local_38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           _Stack_68._M_impl.super__Rb_tree_header._M_header._M_parent;
      (_Stack_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var11;
      (local_38->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
           _Stack_68._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var2 = &_Stack_68._M_impl.super__Rb_tree_header;
      p_Var11 = _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var13 = _Stack_68._M_impl.super__Rb_tree_header._M_header._M_right;
      _Var12 = _Stack_68._M_impl.super__Rb_tree_header._M_header._M_color;
      p_Var8 = &_Stack_68;
      _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      _Stack_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      goto LAB_00106d12;
    }
  }
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Var12 = _S_red;
  p_Var13 = p_Var11;
  p_Var8 = &__return_storage_ptr__->_M_t;
LAB_00106d12:
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Var11;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = p_Var13;
  (((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
     *)p_Var8)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _Var12;
  std::
  _Rb_tree<Point,_std::pair<const_Point,_std::shared_ptr<Piece>_>,_std::_Select1st<std::pair<const_Point,_std::shared_ptr<Piece>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  ::~_Rb_tree(&_Stack_68);
  return __return_storage_ptr__;
}

Assistant:

map<Point, shared_ptr<Piece>> Board::get_endangered_pieces(const play &single_play) const {
    map<Point, shared_ptr<Piece>> endangered_pieces;
    for (const auto &move : single_play) {
        if (move.second != nullptr) {
            endangered_pieces[move.second->get_position()] = m_board[move.second->get_position()];
        }
        endangered_pieces[move.first->get_position()] = m_board[move.first->get_position()];
    }
    return move(endangered_pieces);
}